

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapBase.h
# Opt level: O3

Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> * __thiscall
Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_4,_false>,_1>::operator=
          (MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_1> *this,
          MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_1> *other)

{
  PointerType pdVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  
  if ((*(long *)&other[2].
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_0>
                 .field_0x8 == 1) &&
     (*(long *)&this[2].
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_0>
                .field_0x8 == 1)) {
    pdVar1 = (other->
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_0>).
             m_data;
    dVar2 = other[1].
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_0>.
            m_data[1];
    pdVar3 = (this->
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_0>).
             m_data;
    dVar4 = this[1].
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false>,_0>.
            m_data[1];
    *pdVar3 = *pdVar1;
    pdVar3[(long)dVar4] = pdVar1[(long)dVar2];
    pdVar3[(long)dVar4 * 2] = pdVar1[(long)dVar2 * 2];
    pdVar3[(long)dVar4 * 3] = pdVar1[(long)dVar2 * 3];
    return (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_4,_false> *)this;
  }
  __assert_fail("v == T(Value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/util/XprHelper.h"
                ,0x6e,
                "Eigen::internal::variable_if_dynamic<long, 1>::variable_if_dynamic(T) [T = long, Value = 1]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    Derived& operator=(const MapBase& other)
    {
      ReadOnlyMapBase::Base::operator=(other);
      return derived();
    }